

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

void __thiscall Js::CompoundString::AppendChars<int,Js::__4>(CompoundString *this,uint *value)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  CharCount CVar4;
  CharCount CVar5;
  charcount_t cVar6;
  errno_t eVar7;
  undefined4 *puVar8;
  char16 *pcVar9;
  size_t sVar10;
  char16_t *pcVar11;
  char16_t *string;
  uint uVar12;
  undefined1 auVar13 [16];
  char16_t local_68 [4];
  char16 localConvertBuffer [21];
  
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00a17c7b;
    *puVar8 = 0;
  }
  bVar2 = OwnsLastBlock(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00a17c7b;
    *puVar8 = 0;
  }
  bVar2 = HasOnlyDirectChars(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_00a17c7b;
    *puVar8 = 0;
  }
  CVar4 = LastBlockCharLength(this);
  CVar5 = LastBlockCharCapacity(this);
  if (CVar5 - CVar4 < 0xb) {
    string = local_68;
  }
  else {
    pcVar9 = LastBlockChars(this);
    string = pcVar9 + CVar4;
  }
  uVar12 = *value;
  if ((ulong)uVar12 < 10) {
    string[0] = L'0';
    string[1] = L'0';
    string[2] = L'0';
    string[3] = (ushort)uVar12 | 0x30;
LAB_00a17b09:
    string[4] = L'\0';
  }
  else {
    if (uVar12 < 100) {
      string[0] = L'0';
      string[1] = L'0';
      uVar3 = (ushort)uVar12 & 0xff;
      auVar13 = ZEXT216(CONCAT11((char)(uVar3 % 10),(char)(uVar3 / 10))) | _DAT_00f6c8f0;
      auVar13 = pmovzxbw(auVar13,auVar13);
      *(int *)(string + 2) = auVar13._0_4_;
      goto LAB_00a17b09;
    }
    if (uVar12 < 1000) {
      *string = L'0';
      string[1] = (ushort)((uVar12 & 0xffff) / 100) | 0x30;
      string[2] = (ushort)(byte)((byte)(((ushort)((uVar12 & 0xffff) / 10) & 0xff) % 10) | 0x30);
      string[3] = (ushort)((uVar12 & 0xffff) % 10) | 0x30;
      goto LAB_00a17b09;
    }
    eVar7 = _ultow_s((ulong)uVar12,(char16_t_conflict *)string,0xb,10);
    if (eVar7 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/DateImplementation.h"
                                  ,0x180,"(err == 0)","err == 0");
      if (!bVar2) goto LAB_00a17c7b;
      *puVar8 = 0;
    }
  }
  sVar10 = PAL_wcslen(string);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  uVar12 = (uint)sVar10;
  if (bVar2) {
    pcVar11 = L"";
    if (8 < uVar12) {
      pcVar11 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",string,pcVar11,sVar10 & 0xffffffff);
    Output::Flush();
  }
  if (CVar5 - CVar4 < 0xb) {
    if (string != local_68) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                  ,0x50c,"(convertBuffer == localConvertBuffer)",
                                  "convertBuffer == localConvertBuffer");
      if (!bVar2) {
LAB_00a17c7b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    AppendGeneric<Js::CompoundString>(local_68,uVar12,this,true);
  }
  else {
    cVar6 = JavascriptString::GetLength((JavascriptString *)this);
    JavascriptString::SetLength((JavascriptString *)this,cVar6 + uVar12);
    SetLastBlockCharLength(this,CVar4 + uVar12);
  }
  return;
}

Assistant:

inline void CompoundString::AppendChars(
        const TValue &value,
        const CharCount maximumAppendCharLength,
        const FConvertToString ConvertToString)
    {
        AppendGeneric(value, maximumAppendCharLength, ConvertToString, this, true);
    }